

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O3

void testBase(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  char **func;
  int patch;
  int min;
  int maj;
  char *extra;
  int local_34;
  int local_30;
  int local_2c;
  char *local_28;
  
  func = &local_28;
  exr_get_library_version(&local_2c,&local_30,&local_34);
  if (((local_2c == 3) && (local_30 == 2)) && (local_34 == 0)) {
    iVar1 = strcmp(local_28,"\"-dev\"");
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Testing OpenEXR library version: ",0x21);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
      std::ostream::operator<<(poVar2,local_34);
      if (*local_28 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-",1);
        if (local_28 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1985a0);
        }
        else {
          sVar3 = strlen(local_28);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_28,sVar3);
        }
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      exr_get_library_version(0,&local_30,&local_34,&local_28);
      exr_get_library_version(&local_2c,0,&local_34,&local_28);
      exr_get_library_version(&local_2c,&local_30,0,&local_28);
      exr_get_library_version(&local_2c,&local_30,&local_34,0);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR testing library, wrong library version: ",0x2e);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::ostream::operator<<(poVar2,local_34);
  if (*local_28 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"-",1);
    if (local_28 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x198870);
    }
    else {
      sVar3 = strlen(local_28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_28,sVar3);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," vs compiled in ",0x10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::ostream::operator<<(poVar2,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"-",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"-dev\"",6);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  core_test_fail("false",(char *)0x21,0x1780c6,(char *)func);
  return;
}

Assistant:

void
testBase (const std::string& tempdir)
{
    int         maj, min, patch;
    const char* extra;
    const char* compextra = COMP_EXTRA;

    exr_get_library_version (&maj, &min, &patch, &extra);
    if (maj != COMP_MAJ || min != COMP_MIN || patch != COMP_PATCH ||
        !strcmp (extra, compextra))
    {
        std::cerr << "ERROR testing library, wrong library version: " << maj
                  << "." << min << "." << patch;
        if (extra[0] != '\0') std::cerr << "-" << extra;
        std::cerr << " vs compiled in " << COMP_MAJ << "." << COMP_MIN << "."
                  << COMP_PATCH;
        if (compextra[0] != '\0') std::cerr << "-" << compextra;
        std::cerr << std::endl;
        EXRCORE_TEST (false);
    }
    std::cout << "Testing OpenEXR library version: " << maj << "." << min << "."
              << patch;
    if (extra[0] != '\0') std::cout << "-" << extra;
    std::cout << std::endl;

    exr_get_library_version (NULL, &min, &patch, &extra);
    exr_get_library_version (&maj, NULL, &patch, &extra);
    exr_get_library_version (&maj, &min, NULL, &extra);
    exr_get_library_version (&maj, &min, &patch, NULL);
}